

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchriter.cpp
# Opt level: O2

UChar32 __thiscall icu_63::UCharCharacterIterator::first32(UCharCharacterIterator *this)

{
  char16_t cVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  iVar2 = (this->super_CharacterIterator).begin;
  (this->super_CharacterIterator).pos = iVar2;
  iVar3 = (this->super_CharacterIterator).end;
  uVar4 = 0xffff;
  if (iVar2 < iVar3) {
    cVar1 = this->text[iVar2];
    uVar4 = (uint)(ushort)cVar1;
    if ((((cVar1 & 0xfc00U) == 0xd800) && (iVar2 + 1 != iVar3)) &&
       (uVar5 = (uint)(ushort)this->text[iVar2 + 1], (uVar5 & 0xfc00) == 0xdc00)) {
      uVar4 = (uint)(ushort)cVar1 * 0x400 + uVar5 + 0xfca02400;
    }
  }
  return uVar4;
}

Assistant:

UChar32
UCharCharacterIterator::first32() {
    pos = begin;
    if(pos < end) {
        int32_t i = pos;
        UChar32 c;
        U16_NEXT(text, i, end, c);
        return c;
    } else {
        return DONE;
    }
}